

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::ArrayOutputStream::BackUp(ArrayOutputStream *this,int count)

{
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined1 auVar4 [16];
  LogMessageFatal local_78 [23];
  Voidify local_61;
  string *local_60;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_48 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  ArrayOutputStream *pAStack_10;
  int count_local;
  ArrayOutputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = count;
  pAStack_10 = this;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(count);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->last_returned_size_);
  local_20 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"count <= last_returned_size_");
  if (local_20 != (string *)0x0) {
    local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x6d,local_48._0_8_,local_48._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [58])
                               "BackUp() can not exceed the size of the last Next() call.");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (absl_log_internal_check_op_result._4_4_);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_60 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"count >= 0");
  if (local_60 != (string *)0x0) {
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x6f,auVar4._0_8_,auVar4._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
  }
  this->position_ = this->position_ - absl_log_internal_check_op_result._4_4_;
  this->last_returned_size_ = this->last_returned_size_ - absl_log_internal_check_op_result._4_4_;
  return;
}

Assistant:

void ArrayOutputStream::BackUp(int count) {
  ABSL_CHECK_LE(count, last_returned_size_)
      << "BackUp() can not exceed the size of the last Next() call.";
  ABSL_CHECK_GE(count, 0);
  position_ -= count;
  last_returned_size_ -= count;
}